

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atlas.c
# Opt level: O2

uint32_t chck_atlas_pop(chck_atlas *atlas)

{
  uint32_t uVar1;
  chck_atlas_texture *pcVar2;
  uint uVar3;
  ulong size;
  
  if (atlas == (chck_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/atlas.c"
                  ,0xb9,"uint32_t chck_atlas_pop(struct chck_atlas *)");
  }
  uVar1 = atlas->count;
  if (uVar1 == 0) {
    uVar1 = 0;
  }
  else {
    pcVar2 = atlas->textures;
    size = (ulong)(uVar1 - 1);
    uVar3 = pcVar2[size].rect.h * pcVar2[size].rect.w;
    atlas->total_area = atlas->total_area - uVar3;
    if (uVar1 == 1) {
      free(pcVar2);
      pcVar2 = (chck_atlas_texture *)0x0;
    }
    else {
      pcVar2 = (chck_atlas_texture *)chck_realloc_mul_of(pcVar2,size,(ulong)uVar3);
      if (pcVar2 == (chck_atlas_texture *)0x0) {
        return atlas->count;
      }
    }
    atlas->textures = pcVar2;
    uVar1 = atlas->count - 1;
    atlas->count = uVar1;
  }
  return uVar1;
}

Assistant:

uint32_t
chck_atlas_pop(struct chck_atlas *atlas)
{
   assert(atlas);

   if (atlas->count <= 0)
      return atlas->count;

   struct chck_atlas_texture *t = &atlas->textures[atlas->count - 1];
   atlas->total_area -= t->rect.w * t->rect.h;

   void *tmp = NULL;
   if (atlas->count > 1) {
      if (!(tmp = chck_realloc_mul_of(atlas->textures, (atlas->count - 1), sizeof(*atlas->textures))))
         return atlas->count;
   } else {
      free(atlas->textures);
   }

   atlas->textures = tmp;
   atlas->count -= 1;
   return atlas->count;
}